

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void duckdb::TemplatedFetchCommitted<duckdb::interval_t>(UpdateInfo *info,Vector *result)

{
  undefined8 *puVar1;
  data_ptr_t pdVar2;
  data_ptr_t __dest;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (info->N != 0) {
    __dest = result->data;
    uVar4 = (ulong)info->max;
    if (info->N == 0x800) {
      switchD_015ff80e::default(__dest,(void *)((long)&info[1].segment + uVar4 * 4),0x8000);
      return;
    }
    uVar5 = 0;
    do {
      puVar1 = (undefined8 *)((long)&info[1].segment + uVar4 * 4);
      uVar3 = puVar1[1];
      pdVar2 = __dest + (ulong)*(uint *)((long)&info[1].segment + uVar5 * 4) * 0x10;
      *(undefined8 *)pdVar2 = *puVar1;
      *(undefined8 *)(pdVar2 + 8) = uVar3;
      uVar5 = uVar5 + 1;
      uVar4 = uVar4 + 4;
    } while (uVar5 < info->N);
  }
  return;
}

Assistant:

static void MergeUpdateInfo(UpdateInfo &current, T *result_data) {
	auto tuples = current.GetTuples();
	auto info_data = current.GetData<T>();
	if (current.N == STANDARD_VECTOR_SIZE) {
		// special case: update touches ALL tuples of this vector
		// in this case we can just memcpy the data
		// since the layout of the update info is guaranteed to be [0, 1, 2, 3, ...]
		memcpy(result_data, info_data, sizeof(T) * current.N);
	} else {
		for (idx_t i = 0; i < current.N; i++) {
			result_data[tuples[i]] = info_data[i];
		}
	}
}